

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::EnableLanguage
          (cmGlobalGhsMultiGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *l,cmMakefile *mf,bool optional)

{
  char *value;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_SYSTEM_NAME",&local_49);
  cmMakefile::AddDefinition(mf,&local_48,"GHS-MULTI");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GHSMULTI",&local_49);
  cmMakefile::AddDefinition(mf,&local_48,"1");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GHS_TARGET_PLATFORM",&local_49);
  value = cmMakefile::GetDefinition(mf,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (value == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "Green Hills MULTI: GHS_TARGET_PLATFORM not specified; defaulting to \"integrity\"",
               &local_49);
    cmSystemTools::Message(&local_48,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_48);
    value = "integrity";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GHS_TARGET_PLATFORM",&local_49);
  cmMakefile::AddCacheDefinition(mf,&local_48,value,"Name of GHS target platform.",STRING,false);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GHS_OS_DIR",&local_49);
  cmMakefile::GetSafeDefinition(mf,&local_48);
  std::__cxx11::string::_M_assign((string *)&this->OsDir);
  std::__cxx11::string::~string((string *)&local_48);
  cmGlobalGenerator::EnableLanguage(&this->super_cmGlobalGenerator,l,mf,optional);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::EnableLanguage(
  std::vector<std::string> const& l, cmMakefile* mf, bool optional)
{
  mf->AddDefinition("CMAKE_SYSTEM_NAME", "GHS-MULTI");

  mf->AddDefinition("GHSMULTI", "1"); // identifier for user CMake files

  const char* tgtPlatform = mf->GetDefinition("GHS_TARGET_PLATFORM");
  if (!tgtPlatform) {
    cmSystemTools::Message("Green Hills MULTI: GHS_TARGET_PLATFORM not "
                           "specified; defaulting to \"integrity\"");
    tgtPlatform = "integrity";
  }

  /* store the platform name for later use */
  mf->AddCacheDefinition("GHS_TARGET_PLATFORM", tgtPlatform,
                         "Name of GHS target platform.", cmStateEnums::STRING);

  /* store original OS location */
  this->OsDir = mf->GetSafeDefinition("GHS_OS_DIR");

  this->cmGlobalGenerator::EnableLanguage(l, mf, optional);
}